

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_avx2.c
# Opt level: O2

void aom_highbd_convolve_copy_avx2
               (uint16_t *src,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,int w,int h)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  
  if (w == 2) {
    do {
      *(undefined4 *)dst = *(undefined4 *)src;
      *(undefined4 *)(dst + dst_stride) = *(undefined4 *)(src + src_stride);
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 4) {
    do {
      uVar3 = *(undefined8 *)(src + src_stride);
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + dst_stride) = uVar3;
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 8) {
    do {
      uVar3 = *(undefined8 *)(src + 4);
      uVar4 = *(undefined8 *)(src + src_stride);
      uVar5 = *(undefined8 *)(src + src_stride + 4);
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + 4) = uVar3;
      *(undefined8 *)(dst + dst_stride) = uVar4;
      *(undefined8 *)(dst + dst_stride + 4) = uVar5;
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 0x10) {
    do {
      uVar3 = *(undefined8 *)(src + 4);
      uVar4 = *(undefined8 *)(src + 8);
      uVar5 = *(undefined8 *)(src + 0xc);
      puVar1 = src + src_stride;
      uVar6 = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 4);
      uVar8 = *(undefined8 *)(puVar1 + 8);
      uVar9 = *(undefined8 *)(puVar1 + 0xc);
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + 4) = uVar3;
      *(undefined8 *)(dst + 8) = uVar4;
      *(undefined8 *)(dst + 0xc) = uVar5;
      puVar1 = dst + dst_stride;
      *(undefined8 *)puVar1 = uVar6;
      *(undefined8 *)(puVar1 + 4) = uVar7;
      *(undefined8 *)(puVar1 + 8) = uVar8;
      *(undefined8 *)(puVar1 + 0xc) = uVar9;
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 0x20) {
    do {
      uVar3 = *(undefined8 *)src;
      uVar4 = *(undefined8 *)(src + 4);
      uVar5 = *(undefined8 *)(src + 8);
      uVar6 = *(undefined8 *)(src + 0xc);
      uVar7 = *(undefined8 *)(src + 0x10);
      uVar8 = *(undefined8 *)(src + 0x14);
      uVar9 = *(undefined8 *)(src + 0x18);
      uVar10 = *(undefined8 *)(src + 0x1c);
      puVar1 = src + src_stride;
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 4);
      uVar13 = *(undefined8 *)(puVar1 + 8);
      uVar14 = *(undefined8 *)(puVar1 + 0xc);
      puVar1 = src + src_stride + 0x10;
      uVar15 = *(undefined8 *)puVar1;
      uVar16 = *(undefined8 *)(puVar1 + 4);
      uVar17 = *(undefined8 *)(puVar1 + 8);
      uVar18 = *(undefined8 *)(puVar1 + 0xc);
      src = src + src_stride * 2;
      *(undefined8 *)dst = uVar3;
      *(undefined8 *)(dst + 4) = uVar4;
      *(undefined8 *)(dst + 8) = uVar5;
      *(undefined8 *)(dst + 0xc) = uVar6;
      *(undefined8 *)(dst + 0x10) = uVar7;
      *(undefined8 *)(dst + 0x14) = uVar8;
      *(undefined8 *)(dst + 0x18) = uVar9;
      *(undefined8 *)(dst + 0x1c) = uVar10;
      puVar1 = dst + dst_stride;
      *(undefined8 *)puVar1 = uVar11;
      *(undefined8 *)(puVar1 + 4) = uVar12;
      *(undefined8 *)(puVar1 + 8) = uVar13;
      *(undefined8 *)(puVar1 + 0xc) = uVar14;
      puVar1 = dst + dst_stride + 0x10;
      *(undefined8 *)puVar1 = uVar15;
      *(undefined8 *)(puVar1 + 4) = uVar16;
      *(undefined8 *)(puVar1 + 8) = uVar17;
      *(undefined8 *)(puVar1 + 0xc) = uVar18;
      dst = dst + dst_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 0x40) {
    do {
      uVar3 = *(undefined8 *)(src + 4);
      uVar4 = *(undefined8 *)(src + 8);
      uVar5 = *(undefined8 *)(src + 0xc);
      uVar6 = *(undefined8 *)(src + 0x10);
      uVar7 = *(undefined8 *)(src + 0x14);
      uVar8 = *(undefined8 *)(src + 0x18);
      uVar9 = *(undefined8 *)(src + 0x1c);
      uVar10 = *(undefined8 *)(src + 0x20);
      uVar11 = *(undefined8 *)(src + 0x24);
      uVar12 = *(undefined8 *)(src + 0x28);
      uVar13 = *(undefined8 *)(src + 0x2c);
      uVar14 = *(undefined8 *)(src + 0x30);
      uVar15 = *(undefined8 *)(src + 0x34);
      uVar16 = *(undefined8 *)(src + 0x38);
      uVar17 = *(undefined8 *)(src + 0x3c);
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + 4) = uVar3;
      *(undefined8 *)(dst + 8) = uVar4;
      *(undefined8 *)(dst + 0xc) = uVar5;
      *(undefined8 *)(dst + 0x10) = uVar6;
      *(undefined8 *)(dst + 0x14) = uVar7;
      *(undefined8 *)(dst + 0x18) = uVar8;
      *(undefined8 *)(dst + 0x1c) = uVar9;
      *(undefined8 *)(dst + 0x20) = uVar10;
      *(undefined8 *)(dst + 0x24) = uVar11;
      *(undefined8 *)(dst + 0x28) = uVar12;
      *(undefined8 *)(dst + 0x2c) = uVar13;
      *(undefined8 *)(dst + 0x30) = uVar14;
      *(undefined8 *)(dst + 0x34) = uVar15;
      *(undefined8 *)(dst + 0x38) = uVar16;
      *(undefined8 *)(dst + 0x3c) = uVar17;
      puVar2 = src + src_stride;
      uVar3 = *(undefined8 *)(puVar2 + 4);
      uVar4 = *(undefined8 *)(puVar2 + 8);
      uVar5 = *(undefined8 *)(puVar2 + 0xc);
      puVar1 = src + src_stride + 0x10;
      uVar6 = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 4);
      uVar8 = *(undefined8 *)(puVar1 + 8);
      uVar9 = *(undefined8 *)(puVar1 + 0xc);
      puVar1 = src + src_stride + 0x20;
      uVar10 = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 4);
      uVar12 = *(undefined8 *)(puVar1 + 8);
      uVar13 = *(undefined8 *)(puVar1 + 0xc);
      puVar1 = src + src_stride + 0x30;
      uVar14 = *(undefined8 *)puVar1;
      uVar15 = *(undefined8 *)(puVar1 + 4);
      uVar16 = *(undefined8 *)(puVar1 + 8);
      uVar17 = *(undefined8 *)(puVar1 + 0xc);
      src = src + src_stride * 2;
      puVar1 = dst + dst_stride;
      *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
      *(undefined8 *)(puVar1 + 4) = uVar3;
      *(undefined8 *)(puVar1 + 8) = uVar4;
      *(undefined8 *)(puVar1 + 0xc) = uVar5;
      puVar1 = dst + dst_stride + 0x10;
      *(undefined8 *)puVar1 = uVar6;
      *(undefined8 *)(puVar1 + 4) = uVar7;
      *(undefined8 *)(puVar1 + 8) = uVar8;
      *(undefined8 *)(puVar1 + 0xc) = uVar9;
      puVar1 = dst + dst_stride + 0x20;
      *(undefined8 *)puVar1 = uVar10;
      *(undefined8 *)(puVar1 + 4) = uVar11;
      *(undefined8 *)(puVar1 + 8) = uVar12;
      *(undefined8 *)(puVar1 + 0xc) = uVar13;
      puVar1 = dst + dst_stride + 0x30;
      *(undefined8 *)puVar1 = uVar14;
      *(undefined8 *)(puVar1 + 4) = uVar15;
      *(undefined8 *)(puVar1 + 8) = uVar16;
      *(undefined8 *)(puVar1 + 0xc) = uVar17;
      dst = dst + dst_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else {
    do {
      highbd_copy_128(src,dst);
      highbd_copy_128(src + src_stride,dst + dst_stride);
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  return;
}

Assistant:

void aom_highbd_convolve_copy_avx2(const uint16_t *src, ptrdiff_t src_stride,
                                   uint16_t *dst, ptrdiff_t dst_stride, int w,
                                   int h) {
  // The w == 8 case uses _mm_store_si128(), which requires its output address
  // be aligned on a 16-byte boundary.
  if (w == 8) {
    assert(!((intptr_t)dst % 16));
    assert(!(dst_stride % 8));
  }

  if (w == 2) {
    do {
      memmove(dst, src, 2 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      memmove(dst, src, 2 * sizeof(*src));
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 4) {
    do {
      __m128i s[2];
      s[0] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      _mm_storel_epi64((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_storel_epi64((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 8) {
    do {
      __m128i s[2];
      s[0] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      _mm_store_si128((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 16) {
    do {
      __m256i s[2];
      s[0] = _mm256_loadu_si256((__m256i *)src);
      src += src_stride;
      s[1] = _mm256_loadu_si256((__m256i *)src);
      src += src_stride;
      _mm256_storeu_si256((__m256i *)dst, s[0]);
      dst += dst_stride;
      _mm256_storeu_si256((__m256i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 32) {
    do {
      __m256i s[4];
      s[0] = _mm256_loadu_si256((__m256i *)(src + 0 * 16));
      s[1] = _mm256_loadu_si256((__m256i *)(src + 1 * 16));
      src += src_stride;
      s[2] = _mm256_loadu_si256((__m256i *)(src + 0 * 16));
      s[3] = _mm256_loadu_si256((__m256i *)(src + 1 * 16));
      src += src_stride;
      _mm256_storeu_si256((__m256i *)(dst + 0 * 16), s[0]);
      _mm256_storeu_si256((__m256i *)(dst + 1 * 16), s[1]);
      dst += dst_stride;
      _mm256_storeu_si256((__m256i *)(dst + 0 * 16), s[2]);
      _mm256_storeu_si256((__m256i *)(dst + 1 * 16), s[3]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 64) {
    do {
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else {
    assert(w == 128);
    do {
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  }
}